

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall kj::anon_unknown_36::WebSocketPipeImpl::close(WebSocketPipeImpl *this,int __fd)

{
  Coroutine<void> *this_00;
  Promise<void> *promise;
  PromiseAwaiter<void> *pPVar1;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *adapterConstructorParams_1;
  kj *this_01;
  WebSocket *pWVar2;
  PromiseArenaMember *pPVar3;
  SourceLocation location;
  bool bVar4;
  uint uVar5;
  coroutine_handle<void> coroutine;
  undefined8 in_RCX;
  ushort in_DX;
  undefined4 in_register_00000034;
  WebSocketPipeImpl *adapterConstructorParams;
  undefined8 in_R8;
  
  adapterConstructorParams = (WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd);
  coroutine._M_fr_ptr = operator_new(0x5f0);
  *(code **)coroutine._M_fr_ptr = close;
  *(code **)((long)coroutine._M_fr_ptr + 8) = close;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = in_R8;
  *(WebSocketPipeImpl **)((long)coroutine._M_fr_ptr + 0x5d8) = adapterConstructorParams;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  location.function = "close";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf1f;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  pWVar2 = (adapterConstructorParams->state).ptr;
  if (pWVar2 == (WebSocket *)0x0) {
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    adapterConstructorParams_1 =
         (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          *)((long)coroutine._M_fr_ptr + 0x5a8);
    this_01 = (kj *)((long)coroutine._M_fr_ptr + 0x5d0);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x5a8) = 3;
    *(ushort *)((long)coroutine._M_fr_ptr + 0x5b0) = in_DX;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5b8) = in_RCX;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5c0) = in_R8;
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              (this_01,adapterConstructorParams,adapterConstructorParams_1);
    co_await<void>(pPVar1,(Promise<void> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 1;
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
    if (bVar4) goto LAB_003b8fff;
    kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
    pPVar3 = *(PromiseArenaMember **)this_01;
    if (pPVar3 != (PromiseArenaMember *)0x0) {
      *(undefined8 *)this_01 = 0;
      kj::_::PromiseDisposer::dispose(pPVar3);
    }
    uVar5 = adapterConstructorParams_1->tag;
    if (uVar5 == 2) {
      uVar5 = 0;
    }
    if (uVar5 == 3) {
      uVar5 = 0;
    }
    adapterConstructorParams_1->tag = uVar5;
  }
  else {
    promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x5c8);
    (*pWVar2->_vptr_WebSocket[2])(promise,pWVar2,(ulong)in_DX,in_RCX,in_R8);
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    co_await<void>(pPVar1,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 0;
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
    if (bVar4) goto LAB_003b8fff;
    kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
    pPVar3 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar3 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar3);
    }
  }
  *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x5d8) + 0x40) =
       *(long *)((long)coroutine._M_fr_ptr + 0x5e0) +
       *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x5d8) + 0x40) + 1;
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x5e9));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5e8) = 2;
LAB_003b8fff:
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    KJ_IF_SOME(s, state) {
      co_await s.close(code, reason);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(ClosePtr { code, reason }));
    }